

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
Lexer::lexTheFlightTextFile_abi_cxx11_
          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer pbVar3;
  pointer pcVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  _Rb_tree_node_base *p_Var15;
  long *plVar16;
  long lVar17;
  Lexer *this_00;
  pointer pbVar18;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  long local_560;
  ifstream inFile;
  byte abStack_540 [488];
  undefined1 local_358 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  has_key_words;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  long local_2e8;
  char local_2e0;
  undefined7 uStack_2df;
  size_type sStack_2d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  long local_2c8;
  char local_2c0;
  undefined7 uStack_2bf;
  size_type sStack_2b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  long local_2a8;
  char local_2a0;
  undefined7 uStack_29f;
  size_type sStack_298;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  long local_288;
  char local_280;
  undefined7 uStack_27f;
  size_type sStack_278;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  long local_268;
  char local_260;
  undefined7 uStack_25f;
  size_type sStack_258;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  long local_248;
  char local_240;
  undefined7 uStack_23f;
  size_type sStack_238;
  undefined4 local_230;
  undefined4 uStack_22c;
  string op;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  long local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  size_type sStack_1a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  long local_190;
  char local_188;
  undefined7 uStack_187;
  size_type sStack_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  long local_170;
  long local_168;
  undefined8 uStack_160;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  long local_150;
  long local_148;
  undefined8 uStack_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  long local_130;
  char local_128;
  undefined7 uStack_127;
  size_type sStack_120;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  long local_110;
  char local_108;
  undefined7 uStack_107;
  size_type sStack_100;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_vector;
  long *local_d8;
  long local_d0;
  long local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  string line;
  string left;
  string right;
  string sec_right;
  
  std::ifstream::ifstream((string *)&local_560);
  std::ifstream::open((string *)&local_560,(_Ios_Openmode)this);
  if ((abStack_540[*(long *)(local_560 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error opeing a file",0x13);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::ifstream::close();
    exit(1);
  }
  local_b8 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  do {
    do {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_560 + -0x18) + (char)(istream *)&local_560
                             );
      this_00 = (Lexer *)local_b8;
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_560,(string *)local_b8,cVar5);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        std::ifstream::close();
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(__return_storage_ptr__,&this->text_commands_lexed);
        if (local_b8 != (undefined1  [8])&line._M_string_length) {
          operator_delete((void *)local_b8,
                          CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) +
                          1);
        }
        std::ifstream::~ifstream(&local_560);
        return __return_storage_ptr__;
      }
    } while (line._M_dataplus._M_p == (pointer)0x0);
    trim((string *)&stack0xfffffffffffffdd0,this_00,(string *)local_b8);
    std::__cxx11::string::operator=((string *)local_b8,(string *)&stack0xfffffffffffffdd0);
    if ((size_type *)_local_230 != &op._M_string_length) {
      operator_delete(_local_230,op._M_string_length + 1);
    }
    auStack_f8 = (undefined1  [8])0x0;
    command_vector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    command_vector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar8 = std::__cxx11::string::find((char *)local_b8,0x110074,0);
    uVar9 = std::__cxx11::string::find((char *)local_b8,0x11007a,0);
    uVar10 = std::__cxx11::string::find((char *)local_b8,0x110064,0);
    cVar5 = (char)(Lexer *)local_b8;
    lVar11 = std::__cxx11::string::find(cVar5,0x28);
    lVar12 = std::__cxx11::string::find((char *)local_b8,0x110992,0);
    lVar13 = std::__cxx11::string::find((char *)local_b8,0x110068,0);
    has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count =
         std::__cxx11::string::find(cVar5,0x7d);
    local_230 = (int)uVar8;
    op._M_dataplus._M_p = (pointer)&op.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&op,"while","");
    local_200[0] = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"if","");
    local_1e0 = (undefined4)uVar10;
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"var","");
    __l._M_len = 3;
    __l._M_array = (iterator)&stack0xfffffffffffffdd0;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_358,__l,(less<int> *)(line.field_2._M_local_buf + 8),
          (allocator_type *)(left.field_2._M_local_buf + 8));
    lVar17 = -0x78;
    plVar16 = local_1c8;
    do {
      if (plVar16 != (long *)plVar16[-2]) {
        operator_delete((long *)plVar16[-2],*plVar16 + 1);
      }
      plVar16 = plVar16 + -5;
      lVar17 = lVar17 + 0x28;
    } while (lVar17 != 0);
    if ((uVar9 & uVar8 & uVar10) == 0xffffffffffffffff) {
      if (lVar13 == -1) {
        local_2f0._M_current = &local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_b8,line._M_dataplus._M_p + (long)local_b8);
        line.field_2._M_local_buf[8] = 0x20;
        _Var14 = std::
                 __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (local_2f0,local_2f0._M_current + local_2e8,
                            (char *)((long)&line.field_2 + 8));
        op._M_dataplus._M_p = _Var14._M_current + -(long)local_2f0._M_current;
        *_Var14._M_current = '\0';
        if (local_2f0._M_current == &local_2e0) {
          op.field_2._M_allocated_capacity = sStack_2d8;
          _local_230 = (pointer)&op._M_string_length;
        }
        else {
          _local_230 = local_2f0._M_current;
        }
        op._M_string_length = CONCAT71(uStack_2df,local_2e0);
        local_2e8 = 0;
        local_2e0 = '\0';
        local_2f0._M_current = &local_2e0;
        std::__cxx11::string::operator=((string *)local_b8,(string *)&stack0xfffffffffffffdd0);
        if ((size_type *)_local_230 != &op._M_string_length) {
          operator_delete(_local_230,op._M_string_length + 1);
        }
        if (local_2f0._M_current != &local_2e0) {
          operator_delete(local_2f0._M_current,CONCAT71(uStack_2df,local_2e0) + 1);
        }
      }
      lVar12 = std::__cxx11::string::find((char)(value_type *)local_b8,0x3d);
      if (lVar12 == -1) {
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdd0,(ulong)local_b8);
          local_2d0._M_current = &local_2c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,_local_230,op._M_dataplus._M_p + _local_230);
          psVar2 = &left._M_string_length;
          left.field_2._M_local_buf[8] = 0x28;
          _Var14 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (local_2d0,local_2d0._M_current + local_2c8,
                              (char *)((long)&left.field_2 + 8));
          left._M_dataplus._M_p = _Var14._M_current + -(long)local_2d0._M_current;
          *_Var14._M_current = '\0';
          psVar1 = &right._M_string_length;
          if (local_2d0._M_current == &local_2c0) {
            left.field_2._M_allocated_capacity = sStack_2b8;
            line.field_2._8_8_ = psVar2;
          }
          else {
            line.field_2._8_8_ = local_2d0._M_current;
          }
          left._M_string_length = CONCAT71(uStack_2bf,local_2c0);
          local_2c8 = 0;
          local_2c0 = '\0';
          local_2d0._M_current = &local_2c0;
          std::__cxx11::string::operator=
                    ((string *)&stack0xfffffffffffffdd0,(string *)(line.field_2._M_local_buf + 8));
          if ((size_type *)line.field_2._8_8_ != psVar2) {
            operator_delete((void *)line.field_2._8_8_,left._M_string_length + 1);
          }
          if (local_2d0._M_current != &local_2c0) {
            operator_delete(local_2d0._M_current,CONCAT71(uStack_2bf,local_2c0) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_f8,(value_type *)&stack0xfffffffffffffdd0);
          plVar16 = (long *)std::__cxx11::string::erase((ulong)local_b8,0);
          line.field_2._8_8_ = psVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&line.field_2 + 8),*plVar16,plVar16[1] + *plVar16);
          local_2b0._M_current = &local_2a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,line.field_2._8_8_,
                     left._M_dataplus._M_p + line.field_2._8_8_);
          right.field_2._M_local_buf[8] = 0x28;
          _Var14 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (local_2b0,local_2b0._M_current + local_2a8,
                              (char *)((long)&right.field_2 + 8));
          right._M_dataplus._M_p = _Var14._M_current + -(long)local_2b0._M_current;
          *_Var14._M_current = '\0';
          if (local_2b0._M_current == &local_2a0) {
            right.field_2._M_allocated_capacity = sStack_298;
            left.field_2._8_8_ = psVar1;
          }
          else {
            left.field_2._8_8_ = local_2b0._M_current;
          }
          right._M_string_length = CONCAT71(uStack_29f,local_2a0);
          local_2a8 = 0;
          local_2a0 = '\0';
          local_2b0._M_current = &local_2a0;
          std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),
                     (string *)(left.field_2._M_local_buf + 8));
          if ((size_type *)left.field_2._8_8_ != psVar1) {
            operator_delete((void *)left.field_2._8_8_,right._M_string_length + 1);
          }
          if (local_2b0._M_current != &local_2a0) {
            operator_delete(local_2b0._M_current,CONCAT71(uStack_29f,local_2a0) + 1);
          }
          local_290._M_current = &local_280;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,line.field_2._8_8_,
                     left._M_dataplus._M_p + line.field_2._8_8_);
          right.field_2._M_local_buf[8] = 0x29;
          _Var14 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (local_290,local_290._M_current + local_288,
                              (char *)((long)&right.field_2 + 8));
          right._M_dataplus._M_p = _Var14._M_current + -(long)local_290._M_current;
          *_Var14._M_current = '\0';
          if (local_290._M_current == &local_280) {
            right.field_2._M_allocated_capacity = sStack_278;
            left.field_2._8_8_ = psVar1;
          }
          else {
            left.field_2._8_8_ = local_290._M_current;
          }
          right._M_string_length = CONCAT71(uStack_27f,local_280);
          local_288 = 0;
          local_280 = '\0';
          local_290._M_current = &local_280;
          std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),
                     (string *)(left.field_2._M_local_buf + 8));
          if ((size_type *)left.field_2._8_8_ != psVar1) {
            operator_delete((void *)left.field_2._8_8_,right._M_string_length + 1);
          }
          if (local_290._M_current != &local_280) {
            operator_delete(local_290._M_current,CONCAT71(uStack_27f,local_280) + 1);
          }
          local_270._M_current = &local_260;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,line.field_2._8_8_,
                     left._M_dataplus._M_p + line.field_2._8_8_);
          right.field_2._M_local_buf[8] = 0x22;
          _Var14 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (local_270,local_270._M_current + local_268,
                              (char *)((long)&right.field_2 + 8));
          right._M_dataplus._M_p = _Var14._M_current + -(long)local_270._M_current;
          *_Var14._M_current = '\0';
          if (local_270._M_current == &local_260) {
            right.field_2._M_allocated_capacity = sStack_258;
            left.field_2._8_8_ = psVar1;
          }
          else {
            left.field_2._8_8_ = local_270._M_current;
          }
          right._M_string_length = CONCAT71(uStack_25f,local_260);
          local_268 = 0;
          local_260 = '\0';
          local_270._M_current = &local_260;
          std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),
                     (string *)(left.field_2._M_local_buf + 8));
          if ((size_type *)left.field_2._8_8_ != psVar1) {
            operator_delete((void *)left.field_2._8_8_,right._M_string_length + 1);
          }
          if (local_270._M_current != &local_260) {
            operator_delete(local_270._M_current,CONCAT71(uStack_25f,local_260) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_f8,(value_type *)((long)&line.field_2 + 8));
          if ((size_type *)line.field_2._8_8_ != psVar2) {
LAB_00108c9c:
            operator_delete((void *)line.field_2._8_8_,left._M_string_length + 1);
          }
LAB_00108ca8:
          if ((size_type *)_local_230 != &op._M_string_length) {
            operator_delete(_local_230,op._M_string_length + 1);
          }
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_f8,(value_type *)local_b8);
      }
    }
    else {
      psVar2 = &op._M_string_length;
      for (p_Var15 = has_key_words._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 != (_Rb_tree_node_base *)&has_key_words;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
        if (p_Var15[1]._M_color != ~_S_red) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_f8,(value_type *)&p_Var15[1]._M_parent);
          std::__cxx11::string::erase((ulong)local_b8,(long)(int)p_Var15[1]._M_color);
          local_250._M_current = &local_240;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,local_b8,line._M_dataplus._M_p + (long)local_b8);
          line.field_2._M_local_buf[8] = 0x20;
          _Var14 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (local_250,local_250._M_current + local_248,
                              (char *)((long)&line.field_2 + 8));
          op._M_dataplus._M_p = _Var14._M_current + -(long)local_250._M_current;
          *_Var14._M_current = '\0';
          if (local_250._M_current == &local_240) {
            op.field_2._M_allocated_capacity = sStack_238;
            _local_230 = (pointer)psVar2;
          }
          else {
            _local_230 = local_250._M_current;
          }
          op._M_string_length = CONCAT71(uStack_23f,local_240);
          local_248 = 0;
          local_240 = '\0';
          local_250._M_current = &local_240;
          std::__cxx11::string::operator=((string *)local_b8,(string *)&stack0xfffffffffffffdd0);
          if ((size_type *)_local_230 != psVar2) {
            operator_delete(_local_230,op._M_string_length + 1);
          }
          if (local_250._M_current != &local_240) {
            operator_delete(local_250._M_current,CONCAT71(uStack_23f,local_240) + 1);
          }
        }
      }
      pbVar3 = (this->operators_to_check).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar18 = (this->operators_to_check).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar3;
          pbVar18 = pbVar18 + 1) {
        pcVar4 = (pbVar18->_M_dataplus)._M_p;
        _local_230 = (pointer)psVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xfffffffffffffdd0,pcVar4,pcVar4 + pbVar18->_M_string_length);
        lVar11 = std::__cxx11::string::find(local_b8,(ulong)_local_230,0);
        if (lVar11 != -1) {
          std::__cxx11::string::substr((ulong)((long)&line.field_2 + 8),(ulong)local_b8);
          local_1b8._M_current = &local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,line.field_2._8_8_,
                     left._M_dataplus._M_p + line.field_2._8_8_);
          psVar2 = &right._M_string_length;
          psVar1 = &sec_right._M_string_length;
          right.field_2._M_local_buf[8] = 0x28;
          _Var14 = std::
                   __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (local_1b8,local_1b8._M_current + local_1b0,
                              (char *)((long)&right.field_2 + 8));
          right._M_dataplus._M_p = _Var14._M_current + -(long)local_1b8._M_current;
          *_Var14._M_current = '\0';
          if (local_1b8._M_current == &local_1a8) {
            right.field_2._M_allocated_capacity = sStack_1a0;
            left.field_2._8_8_ = psVar2;
          }
          else {
            left.field_2._8_8_ = local_1b8._M_current;
          }
          right._M_string_length = CONCAT71(uStack_1a7,local_1a8);
          local_1b0 = 0;
          local_1a8 = '\0';
          local_1b8._M_current = &local_1a8;
          std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),
                     (string *)(left.field_2._M_local_buf + 8));
          if ((size_type *)left.field_2._8_8_ != psVar2) {
            operator_delete((void *)left.field_2._8_8_,right._M_string_length + 1);
          }
          if (local_1b8._M_current != &local_1a8) {
            operator_delete(local_1b8._M_current,CONCAT71(uStack_1a7,local_1a8) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_f8,(value_type *)((long)&line.field_2 + 8));
          std::__cxx11::string::erase((ulong)local_b8,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_f8,(value_type *)&stack0xfffffffffffffdd0);
          std::__cxx11::string::erase((ulong)local_b8,0);
          left.field_2._8_8_ = psVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&left.field_2 + 8),local_b8,
                     line._M_dataplus._M_p + (long)local_b8);
          if (lVar12 == -1) {
            iVar6 = std::__cxx11::string::compare((char *)&stack0xfffffffffffffdd0);
            if ((iVar6 == 0) ||
               (iVar6 = std::__cxx11::string::compare((char *)&stack0xfffffffffffffdd0), iVar6 == 0)
               ) {
              local_138._M_current = &local_128;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,left.field_2._8_8_,
                         right._M_dataplus._M_p + left.field_2._8_8_);
              local_d8 = (long *)CONCAT71(local_d8._1_7_,0x29);
              _Var14 = std::
                       __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                 (local_138,local_138._M_current + local_130,
                                  (_Iter_equals_val<const_char>)&local_d8);
              sec_right._M_dataplus._M_p = _Var14._M_current + -(long)local_138._M_current;
              *_Var14._M_current = '\0';
              if (local_138._M_current == &local_128) {
                sec_right.field_2._M_allocated_capacity = sStack_120;
                right.field_2._8_8_ = psVar1;
              }
              else {
                right.field_2._8_8_ = local_138._M_current;
              }
              sec_right._M_string_length = CONCAT71(uStack_127,local_128);
              local_130 = 0;
              local_128 = '\0';
              local_138._M_current = &local_128;
              std::__cxx11::string::operator=
                        ((string *)(left.field_2._M_local_buf + 8),
                         (string *)(right.field_2._M_local_buf + 8));
              if ((size_type *)right.field_2._8_8_ != psVar1) {
                operator_delete((void *)right.field_2._8_8_,sec_right._M_string_length + 1);
              }
              if (local_138._M_current != &local_128) {
                operator_delete(local_138._M_current,CONCAT71(uStack_127,local_128) + 1);
              }
            }
            local_118._M_current = &local_108;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,left.field_2._8_8_,
                       right._M_dataplus._M_p + left.field_2._8_8_);
            local_d8 = (long *)CONCAT71(local_d8._1_7_,0x7b);
            _Var14 = std::
                     __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (local_118,local_118._M_current + local_110,
                                (_Iter_equals_val<const_char>)&local_d8);
            sec_right._M_dataplus._M_p = _Var14._M_current + -(long)local_118._M_current;
            *_Var14._M_current = '\0';
            if (local_118._M_current == &local_108) {
              sec_right.field_2._M_allocated_capacity = sStack_100;
              right.field_2._8_8_ = psVar1;
            }
            else {
              right.field_2._8_8_ = local_118._M_current;
            }
            sec_right._M_string_length = CONCAT71(uStack_107,local_108);
            local_110 = 0;
            local_108 = '\0';
            local_118._M_current = &local_108;
            std::__cxx11::string::operator=
                      ((string *)(left.field_2._M_local_buf + 8),
                       (string *)(right.field_2._M_local_buf + 8));
            if ((size_type *)right.field_2._8_8_ != psVar1) {
              operator_delete((void *)right.field_2._8_8_,sec_right._M_string_length + 1);
            }
            if (local_118._M_current != &local_108) {
              operator_delete(local_118._M_current,CONCAT71(uStack_107,local_108) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_f8,(value_type *)((long)&left.field_2 + 8));
          }
          else {
            std::__cxx11::string::substr((ulong)(right.field_2._M_local_buf + 8),(ulong)local_b8);
            std::__cxx11::string::operator=
                      ((string *)(line.field_2._M_local_buf + 8),
                       (string *)(right.field_2._M_local_buf + 8));
            if ((size_type *)right.field_2._8_8_ != psVar1) {
              operator_delete((void *)right.field_2._8_8_,sec_right._M_string_length + 1);
            }
            local_198._M_current = &local_188;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,line.field_2._8_8_,
                       left._M_dataplus._M_p + line.field_2._8_8_);
            local_d8 = (long *)CONCAT71(local_d8._1_7_,0x28);
            _Var14 = std::
                     __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (local_198,local_198._M_current + local_190,
                                (_Iter_equals_val<const_char>)&local_d8);
            sec_right._M_dataplus._M_p = _Var14._M_current + -(long)local_198._M_current;
            *_Var14._M_current = '\0';
            if (local_198._M_current == &local_188) {
              sec_right.field_2._M_allocated_capacity = sStack_180;
              right.field_2._8_8_ = psVar1;
            }
            else {
              right.field_2._8_8_ = local_198._M_current;
            }
            sec_right._M_string_length = CONCAT71(uStack_187,local_188);
            local_190 = 0;
            local_188 = '\0';
            local_198._M_current = &local_188;
            std::__cxx11::string::operator=
                      ((string *)(line.field_2._M_local_buf + 8),
                       (string *)(right.field_2._M_local_buf + 8));
            if ((size_type *)right.field_2._8_8_ != psVar1) {
              operator_delete((void *)right.field_2._8_8_,sec_right._M_string_length + 1);
            }
            if (local_198._M_current != &local_188) {
              operator_delete(local_198._M_current,CONCAT71(uStack_187,local_188) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_f8,(value_type *)((long)&line.field_2 + 8));
            std::__cxx11::string::erase((ulong)local_b8,0);
            right.field_2._8_8_ = psVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)((long)&right.field_2 + 8),local_b8,
                       line._M_dataplus._M_p + (long)local_b8);
            iVar6 = std::__cxx11::string::compare((char *)&stack0xfffffffffffffdd0);
            if ((iVar6 == 0) ||
               (iVar6 = std::__cxx11::string::compare((char *)&stack0xfffffffffffffdd0), iVar6 == 0)
               ) {
              local_178._M_current = (char *)&local_168;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_178,right.field_2._8_8_,
                         sec_right._M_dataplus._M_p + right.field_2._8_8_);
              sec_right.field_2._M_local_buf[0xf] = ')';
              _Var14 = std::
                       __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                 (local_178,local_178._M_current + local_170,
                                  (char *)((long)&sec_right.field_2 + 0xf));
              local_d0 = (long)_Var14._M_current - (long)local_178._M_current;
              *_Var14._M_current = '\0';
              if ((long *)local_178._M_current == &local_168) {
                uStack_c0 = uStack_160;
                local_d8 = &local_c8;
              }
              else {
                local_d8 = (long *)local_178._M_current;
              }
              local_c8 = CONCAT71(local_168._1_7_,(undefined1)local_168);
              local_170 = 0;
              local_168._0_1_ = 0;
              local_178._M_current = (char *)&local_168;
              std::__cxx11::string::operator=
                        ((string *)(right.field_2._M_local_buf + 8),(string *)&local_d8);
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
              if ((long *)local_178._M_current != &local_168) {
                operator_delete(local_178._M_current,
                                CONCAT71(local_168._1_7_,(undefined1)local_168) + 1);
              }
            }
            local_158._M_current = (char *)&local_148;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,right.field_2._8_8_,
                       sec_right._M_dataplus._M_p + right.field_2._8_8_);
            sec_right.field_2._M_local_buf[0xf] = '\"';
            _Var14 = std::
                     __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (local_158,local_158._M_current + local_150,
                                (char *)((long)&sec_right.field_2 + 0xf));
            local_d0 = (long)_Var14._M_current - (long)local_158._M_current;
            *_Var14._M_current = '\0';
            if ((long *)local_158._M_current == &local_148) {
              uStack_c0 = uStack_140;
              local_d8 = &local_c8;
            }
            else {
              local_d8 = (long *)local_158._M_current;
            }
            local_c8 = CONCAT71(local_148._1_7_,(undefined1)local_148);
            local_150 = 0;
            local_148._0_1_ = 0;
            local_158._M_current = (char *)&local_148;
            std::__cxx11::string::operator=
                      ((string *)(right.field_2._M_local_buf + 8),(string *)&local_d8);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            if ((long *)local_158._M_current != &local_148) {
              operator_delete(local_158._M_current,
                              CONCAT71(local_148._1_7_,(undefined1)local_148) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_f8,(value_type *)((long)&right.field_2 + 8));
            if ((size_type *)right.field_2._8_8_ != psVar1) {
              operator_delete((void *)right.field_2._8_8_,sec_right._M_string_length + 1);
            }
          }
          if ((size_type *)left.field_2._8_8_ != psVar2) {
            operator_delete((void *)left.field_2._8_8_,right._M_string_length + 1);
          }
          if ((size_type *)line.field_2._8_8_ != &left._M_string_length) goto LAB_00108c9c;
          goto LAB_00108ca8;
        }
        if ((size_type *)_local_230 != psVar2) {
          operator_delete(_local_230,op._M_string_length + 1);
        }
      }
    }
    if (has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count != 0xffffffffffffffff) {
      _local_230 = (pointer)&op._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdd0,"}","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffdd0);
      if ((size_type *)_local_230 != &op._M_string_length) {
        operator_delete(_local_230,op._M_string_length + 1);
      }
    }
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&this->text_commands_lexed,(value_type *)auStack_f8);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_358);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_f8);
  } while( true );
}

Assistant:

vector<vector<string>> Lexer::lexTheFlightTextFile() {

  ifstream inFile; // open the file stream
  inFile.open(this->flight_text_file);
  if (inFile.fail()) { // check if opening a file failed
    cerr << "Error opeing a file" << endl;
    inFile.close();
    exit(1);
  }
  string line;
  // lex line after line - i chose to work in the onion slicing method
  while (getline(inFile, line)) {
    if (line.empty()) {
      continue;
    }
    // get rid of tabs
    line = trim(line);
    vector<string> command_vector;
    // important keyword i look for in the string
    string::size_type has_while = line.find("while");
    string::size_type has_if = line.find("if");
    string::size_type has_var = line.find("var");
    string::size_type has_left_parent = line.find('(');
    string::size_type has_sim = line.find("sim");
    string::size_type has_print = line.find("Print");
    string::size_type has_end_condition = line.find('}');
    map<int, string> has_key_words = {{has_while, "while"}, {has_if, "if"},
                                      {has_var, "var"}};
    // NOT var / while / if :
    if (has_if == string::npos && has_while == string::npos && has_var ==
        string::npos) {
      // get rid of spaces in case its not a print
      if (has_print == string::npos) {
        line = this->removeToken(line, ' ');
      }
      // assignments (set vars)
      if (line.find('=') != string::npos) {
        command_vector.push_back(line);
      } else if (has_left_parent != string::npos) {
        string left = line.substr(0, has_left_parent);
        left = this->removeToken(left, '(');
        command_vector.push_back(left);
        string right = line.erase(0, has_left_parent);
        right = this->removeToken(right, '(');
        right = this->removeToken(right, ')');
        right = this->removeToken(right, '"');
        command_vector.push_back(right);
      }
    } else {
      // var / while / if :
      // dont minimize spaces after the keyword while, if, var
      // put the keyword in a command vector and remove her from line :)
      for (auto it = has_key_words.begin(); it != has_key_words.end(); ++it) {
        if (string::size_type(it->first) != string::npos) {
          command_vector.push_back(it->second);
          line.erase(it->first, it->second.size());
          line = this->removeToken(line, ' ');
        }
      }
      // find "<-" , "->" , "=", "<=" , "<", ">" , ">=" .
      // put every part (left, keyword, right" inside command vector
      for (string op : this->operators_to_check) {
        string::size_type has_op = line.find(op);
        if (has_op != string::npos) {
          string left = line.substr(0, has_op);
          left = this->removeToken(left, '(');
          command_vector.push_back(left);
          line.erase(0, has_op);
          command_vector.push_back(op);
          line.erase(0, op.size());
          string right = line;
          if (has_sim != string::npos) {
            left = line.substr(0, 4);
            left = this->removeToken(left, '(');
            command_vector.push_back(left);
            line.erase(0, 4);
            string sec_right = line;
            if (op == "<-" || op == "->") {
              sec_right = this->removeToken(sec_right, ')');
            }
            sec_right = this->removeToken(sec_right, '"');
            command_vector.push_back(sec_right);
            break;
          }
          if (op == "<-" || op == "->") {
            right = this->removeToken(right, ')');
          }
          right = this->removeToken(right, '{');
          command_vector.push_back(right);
          break;
        }
      }
    }
    if (has_end_condition != string::npos) {
      command_vector.push_back("}");
    }
    text_commands_lexed.push_back(command_vector);
  }
  // close the file stream
  inFile.close();
  // return the vector of vectors :) (all the strings representing commands)
  return this->text_commands_lexed;
}